

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryUtilizationContainer.cpp
# Opt level: O2

void __thiscall
MemoryUtilizationContainer::MemoryUtilizationContainer(MemoryUtilizationContainer *this)

{
  int iVar1;
  UtilizationWidget *this_00;
  FlowGridLayout *pFVar2;
  GPUMemDetailsWidget *this_01;
  int gpuId;
  QArrayDataPointer<char16_t> local_40;
  
  UtilizationContainer::UtilizationContainer(&this->super_UtilizationContainer);
  *(undefined ***)&this->super_UtilizationContainer = &PTR_metaObject_00128778;
  *(undefined ***)&(this->super_UtilizationContainer).field_0x10 =
       &PTR__MemoryUtilizationContainer_00128928;
  this_00 = (UtilizationWidget *)operator_new(0x2868);
  MemoryUtilizationWidget::MemoryUtilizationWidget
            ((MemoryUtilizationWidget *)this_00,&this->super_UtilizationContainer);
  (this->super_UtilizationContainer).utilizationWidget = this_00;
  QString::QString((QString *)&local_40,"Memory Utilization");
  UtilizationContainer::build(&this->super_UtilizationContainer,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  gpuId = 0;
  while( true ) {
    iVar1 = InfoProvider::getGPUCount();
    if (iVar1 <= gpuId) break;
    pFVar2 = UtilizationContainer::getDescLayout(&this->super_UtilizationContainer);
    this_01 = (GPUMemDetailsWidget *)operator_new(0x28);
    GPUMemDetailsWidget::GPUMemDetailsWidget(this_01,&this->super_UtilizationContainer,gpuId);
    QLayout::addWidget((QWidget *)pFVar2);
    gpuId = gpuId + 1;
  }
  UtilizationContainer::updateLegend(&this->super_UtilizationContainer);
  return;
}

Assistant:

MemoryUtilizationContainer::MemoryUtilizationContainer() {
    utilizationWidget = new MemoryUtilizationWidget(this);
    build("Memory Utilization");

    for (int i = 0; i < InfoProvider::getGPUCount(); i++)
        getDescLayout()->addWidget(new GPUMemDetailsWidget(this, i));

    updateLegend();
}